

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

int __thiscall
cmake::Build(cmake *this,int jobs,string *dir,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *targets,string *config,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *nativeOptions,cmBuildOptions *buildOptions,bool verbose,string *presetName,
            bool listPresets)

{
  _Base_ptr __k;
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  pointer pcVar3;
  size_type sVar4;
  cmState *pcVar5;
  cmGlobalGenerator *pcVar6;
  pointer pbVar7;
  bool bVar8;
  ReadFileResult result;
  int iVar9;
  int iVar10;
  string *psVar11;
  char *__s;
  iterator iVar12;
  iterator iVar13;
  cmValue cVar14;
  ostream *poVar15;
  char *extraout_RDX;
  undefined4 in_register_00000034;
  undefined8 uVar16;
  _Alloc_hider _Var17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string_view value;
  byte local_921;
  string local_920;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> gen;
  pointer local_8f8;
  __uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> local_8f0;
  string projName;
  string local_898;
  string cachePath;
  string output;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
  local_808;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
  local_7d8;
  _Rb_tree_node_base local_7a0;
  size_t local_780;
  _Rb_tree_node_base local_770;
  _Base_ptr local_750;
  _Rb_tree_node_base local_740;
  pointer local_720;
  pointer pbStack_718;
  pointer local_710;
  pointer pbStack_708;
  __node_base local_700;
  pointer pbStack_6f8;
  pointer local_6f0;
  pointer pbStack_6e8;
  pointer local_6e0;
  pointer pbStack_6d8;
  pointer local_6d0;
  __node_base _Stack_6c8;
  pointer local_6c0;
  pointer pbStack_6b8;
  pointer local_6b0;
  pointer pbStack_6a8;
  _Alloc_hider local_6a0;
  size_type local_698;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_690;
  _Base_ptr local_680;
  pointer puStack_678;
  pointer local_670;
  
  local_8f8 = (pointer)CONCAT44(in_register_00000034,jobs);
  paVar18 = &output.field_2;
  output._M_dataplus._M_p = (pointer)paVar18;
  std::__cxx11::string::_M_construct<char_const*>((string *)&output,"");
  SetHomeDirectory(this,&output);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)output._M_dataplus._M_p != paVar18) {
    operator_delete(output._M_dataplus._M_p,
                    CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                             output.field_2._M_local_buf[0]) + 1);
  }
  output._M_dataplus._M_p = (pointer)paVar18;
  std::__cxx11::string::_M_construct<char_const*>((string *)&output,"");
  SetHomeOutputDirectory(this,&output);
  local_921 = verbose;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)output._M_dataplus._M_p != paVar18) {
    operator_delete(output._M_dataplus._M_p,
                    CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                             output.field_2._M_local_buf[0]) + 1);
  }
  if (presetName->_M_string_length != 0 || listPresets) {
    cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    SetHomeDirectory(this,&output);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)output._M_dataplus._M_p != paVar18) {
      operator_delete(output._M_dataplus._M_p,
                      CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                               output.field_2._M_local_buf[0]) + 1);
    }
    cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
    SetHomeOutputDirectory(this,&output);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)output._M_dataplus._M_p != paVar18) {
      operator_delete(output._M_dataplus._M_p,
                      CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                               output.field_2._M_local_buf[0]) + 1);
    }
    p_Var1 = &local_808._M_impl.super__Rb_tree_header;
    output._M_string_length = 0;
    output.field_2._M_local_buf[0] = '\0';
    local_808._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_808._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_808._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var2 = &local_7d8._M_impl.super__Rb_tree_header;
    local_7d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_7d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_7d8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_7a0._M_left = &local_7a0;
    local_7a0._M_color = _S_red;
    local_7a0._M_parent = (_Base_ptr)0x0;
    local_780 = 0;
    local_770._M_left = &local_770;
    local_770._M_color = _S_red;
    local_770._M_parent = (_Base_ptr)0x0;
    local_750 = (_Base_ptr)0x0;
    local_740._M_left = &local_740;
    local_740._M_color = _S_red;
    local_740._M_parent = (_Base_ptr)0x0;
    local_6a0._M_p = (pointer)&local_690;
    local_6b0 = (pointer)0x0;
    pbStack_6a8 = (pointer)0x0;
    local_6c0 = (pointer)0x0;
    pbStack_6b8 = (pointer)0x0;
    local_6d0 = (pointer)0x0;
    _Stack_6c8._M_nxt = (_Hash_node_base *)0x0;
    local_6e0 = (pointer)0x0;
    pbStack_6d8 = (pointer)0x0;
    local_6f0 = (pointer)0x0;
    pbStack_6e8 = (pointer)0x0;
    local_700._M_nxt = (_Hash_node_base *)0x0;
    pbStack_6f8 = (pointer)0x0;
    local_710 = (pointer)0x0;
    pbStack_708 = (pointer)0x0;
    local_720 = (pointer)0x0;
    pbStack_718 = (pointer)0x0;
    local_698 = 0;
    local_690._M_local_buf[0] = '\0';
    local_680 = (_Base_ptr)0x0;
    puStack_678 = (pointer)0x0;
    local_670 = (pointer)0x0;
    output._M_dataplus._M_p = (pointer)paVar18;
    local_808._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_808._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    local_7d8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_7d8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    local_7a0._M_right = local_7a0._M_left;
    local_770._M_right = local_770._M_left;
    local_740._M_right = local_740._M_left;
    psVar11 = cmState::GetSourceDirectory_abi_cxx11_
                        ((this->State)._M_t.
                         super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                         super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                         super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    result = cmCMakePresetsGraph::ReadProjectPresets((cmCMakePresetsGraph *)&output,psVar11,false);
    if (result == READ_OK) {
      if (listPresets) {
        bVar8 = false;
        cmCMakePresetsGraph::PrintBuildPresetList
                  ((cmCMakePresetsGraph *)&output,(PrintPrecedingNewline *)0x0);
        iVar9 = 0;
      }
      else {
        iVar12 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
                 ::find(&local_7d8,presetName);
        if ((_Rb_tree_header *)iVar12._M_node == p_Var2) {
          psVar11 = cmState::GetSourceDirectory_abi_cxx11_
                              ((this->State)._M_t.
                               super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                               super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                               super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
          cachePath.field_2._8_8_ = (psVar11->_M_dataplus)._M_p;
          cachePath.field_2._M_allocated_capacity = psVar11->_M_string_length;
          cachePath._M_dataplus._M_p = (pointer)0x18;
          cachePath._M_string_length = (size_type)anon_var_dwarf_63a2fc;
          projName._M_string_length = (size_type)&projName.field_2;
          projName._M_dataplus._M_p = &DAT_00000001;
          projName.field_2._M_local_buf[0] = 0x22;
          views_01._M_len = 5;
          views_01._M_array = (iterator)&cachePath;
          cmCatViews_abi_cxx11_(&local_920,views_01);
          cmSystemTools::Error(&local_920);
LAB_0022ad68:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_920._M_dataplus._M_p != &local_920.field_2) {
            operator_delete(local_920._M_dataplus._M_p,local_920.field_2._M_allocated_capacity + 1);
          }
          cmCMakePresetsGraph::PrintBuildPresetList
                    ((cmCMakePresetsGraph *)&output,(PrintPrecedingNewline *)0x0);
        }
        else {
          if ((char)iVar12._M_node[4]._M_color == _S_black) {
            psVar11 = cmState::GetSourceDirectory_abi_cxx11_
                                ((this->State)._M_t.
                                 super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                                 super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
            cachePath.field_2._8_8_ = (psVar11->_M_dataplus)._M_p;
            cachePath.field_2._M_allocated_capacity = psVar11->_M_string_length;
            cachePath._M_dataplus._M_p = (pointer)0x22;
            cachePath._M_string_length = (size_type)anon_var_dwarf_63a309;
            projName._M_string_length = (size_type)&projName.field_2;
            projName._M_dataplus._M_p = &DAT_00000001;
            projName.field_2._M_local_buf[0] = 0x22;
            views_00._M_len = 5;
            views_00._M_array = (iterator)&cachePath;
            cmCatViews_abi_cxx11_(&local_920,views_00);
            cmSystemTools::Error(&local_920);
            goto LAB_0022ad68;
          }
          if (*(char *)&iVar12._M_node[0x18]._M_left == '\0') {
            cachePath._M_dataplus._M_p = (pointer)0x21;
            cachePath._M_string_length = (size_type)anon_var_dwarf_63a316;
            projName._M_string_length = (size_type)(presetName->_M_dataplus)._M_p;
            projName._M_dataplus._M_p = (pointer)presetName->_M_string_length;
            cmStrCat<char[27]>(&local_920,(cmAlphaNum *)&cachePath,(cmAlphaNum *)&projName,
                               (char (*) [27])"\": Invalid macro expansion");
            cmSystemTools::Error(&local_920);
          }
          else {
            if (*(char *)&iVar12._M_node[0x12]._M_parent != '\0') {
              __k = iVar12._M_node + 0x14;
              iVar13 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
                       ::find(&local_808,__k);
              if ((_Rb_tree_header *)iVar13._M_node == p_Var1) {
                cachePath._M_dataplus._M_p = (pointer)0x1c;
                cachePath._M_string_length = (size_type)anon_var_dwarf_63a330;
                psVar11 = cmState::GetSourceDirectory_abi_cxx11_
                                    ((this->State)._M_t.
                                     super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>
                                     .super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
                projName._M_string_length = (size_type)(psVar11->_M_dataplus)._M_p;
                projName._M_dataplus._M_p = (pointer)psVar11->_M_string_length;
                local_898._M_dataplus._M_p._0_1_ = 0x22;
                cmStrCat<char[4],std::__cxx11::string,char>
                          (&local_920,(cmAlphaNum *)&cachePath,(cmAlphaNum *)&projName,
                           (char (*) [4])0x6e9a1f,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k,
                           (char *)&local_898);
                cmSystemTools::Error(&local_920);
              }
              else {
                if ((char)iVar13._M_node[4]._M_color != _S_black) {
                  if ((char)iVar13._M_node[0x21]._M_color == _S_red) {
                    cachePath._M_dataplus._M_p = (pointer)0x25;
                    cachePath._M_string_length = (size_type)anon_var_dwarf_63a34a;
                    projName._M_string_length = *(size_type *)(iVar12._M_node + 0x14);
                    projName._M_dataplus._M_p = (pointer)iVar12._M_node[0x14]._M_parent;
                    cmStrCat<char[27]>(&local_920,(cmAlphaNum *)&cachePath,(cmAlphaNum *)&projName,
                                       (char (*) [27])"\": Invalid macro expansion");
                    cmSystemTools::Error(&local_920);
                    uVar16 = local_920.field_2._M_allocated_capacity;
                    _Var17._M_p = local_920._M_dataplus._M_p;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_920._M_dataplus._M_p != &local_920.field_2) goto LAB_0022abe7;
                    goto LAB_0022abef;
                  }
                  if (*(long *)(iVar13._M_node + 0x1d) != 0) {
                    std::__cxx11::string::_M_assign((string *)dir);
                  }
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::operator=(&(this->UnprocessedPresetEnvironment)._M_t,
                              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&iVar12._M_node[0x12]._M_left);
                  ProcessPresetEnvironment(this);
                  if ((jobs + 1U < 2) && (*(char *)&iVar12._M_node[0x15]._M_parent == '\x01')) {
                    local_8f8 = (pointer)(ulong)*(uint *)&iVar12._M_node[0x15].field_0x4;
                  }
                  pbVar7 = (targets->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  if (pbVar7 == (targets->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish) {
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               targets,pbVar7,iVar12._M_node[0x15]._M_left,
                               iVar12._M_node[0x15]._M_right);
                  }
                  if (config->_M_string_length == 0) {
                    std::__cxx11::string::_M_assign((string *)config);
                  }
                  if ((buildOptions->Clean == false) &&
                     (*(char *)((long)&iVar12._M_node[0x17]._M_parent + 1) == '\x01')) {
                    buildOptions->Clean = *(bool *)&iVar12._M_node[0x17]._M_parent;
                  }
                  if ((buildOptions->ResolveMode == Default) &&
                     (*(char *)((long)&iVar12._M_node[0x18]._M_parent + 4) == '\x01')) {
                    buildOptions->ResolveMode =
                         *(PackageResolveMode *)&iVar12._M_node[0x18]._M_parent;
                  }
                  if ((!verbose) && (*(char *)((long)&iVar12._M_node[0x17]._M_parent + 3) == '\x01')
                     ) {
                    local_921 = *(byte *)((long)&iVar12._M_node[0x17]._M_parent + 2);
                  }
                  pbVar7 = (nativeOptions->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  iVar9 = 1;
                  bVar8 = true;
                  if (pbVar7 == (nativeOptions->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish) {
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               nativeOptions,pbVar7,iVar12._M_node[0x17]._M_left,
                               iVar12._M_node[0x17]._M_right);
                  }
                  goto LAB_0022af4c;
                }
                cachePath._M_dataplus._M_p = (pointer)0x26;
                cachePath._M_string_length = (size_type)anon_var_dwarf_63a33d;
                psVar11 = cmState::GetSourceDirectory_abi_cxx11_
                                    ((this->State)._M_t.
                                     super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>
                                     .super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
                projName._M_string_length = (size_type)(psVar11->_M_dataplus)._M_p;
                projName._M_dataplus._M_p = (pointer)psVar11->_M_string_length;
                local_898._M_dataplus._M_p._0_1_ = 0x22;
                cmStrCat<char[4],std::__cxx11::string,char>
                          (&local_920,(cmAlphaNum *)&cachePath,(cmAlphaNum *)&projName,
                           (char (*) [4])0x6e9a1f,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k,
                           (char *)&local_898);
                cmSystemTools::Error(&local_920);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_920._M_dataplus._M_p != &local_920.field_2) {
                operator_delete(local_920._M_dataplus._M_p,
                                local_920.field_2._M_allocated_capacity + 1);
              }
              PrintPresetList(this,(cmCMakePresetsGraph *)&output);
              goto LAB_0022abef;
            }
            cachePath._M_dataplus._M_p = (pointer)0x24;
            cachePath._M_string_length = (size_type)anon_var_dwarf_63a323;
            psVar11 = cmState::GetSourceDirectory_abi_cxx11_
                                ((this->State)._M_t.
                                 super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                                 super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
            projName._M_string_length = (size_type)(psVar11->_M_dataplus)._M_p;
            projName._M_dataplus._M_p = (pointer)psVar11->_M_string_length;
            local_898._M_dataplus._M_p._0_1_ = 0x22;
            cmStrCat<char[4],std::__cxx11::string,char>
                      (&local_920,(cmAlphaNum *)&cachePath,(cmAlphaNum *)&projName,
                       (char (*) [4])0x6e9a1f,presetName,(char *)&local_898);
            cmSystemTools::Error(&local_920);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_920._M_dataplus._M_p != &local_920.field_2) {
            operator_delete(local_920._M_dataplus._M_p,local_920.field_2._M_allocated_capacity + 1);
          }
          cmCMakePresetsGraph::PrintBuildPresetList
                    ((cmCMakePresetsGraph *)&output,(PrintPrecedingNewline *)0x0);
        }
        bVar8 = false;
        iVar9 = 1;
      }
    }
    else {
      psVar11 = cmState::GetSourceDirectory_abi_cxx11_
                          ((this->State)._M_t.
                           super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                           super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
      pcVar3 = (psVar11->_M_dataplus)._M_p;
      sVar4 = psVar11->_M_string_length;
      __s = cmCMakePresetsGraph::ResultToString(result);
      cachePath._M_dataplus._M_p = (pointer)0x1c;
      cachePath._M_string_length = (size_type)anon_var_dwarf_632d4c;
      cachePath.field_2._M_allocated_capacity = sVar4;
      cachePath.field_2._8_8_ = pcVar3;
      strlen(__s);
      views._M_len = 4;
      views._M_array = (iterator)&cachePath;
      cmCatViews_abi_cxx11_(&projName,views);
      cmSystemTools::Error(&projName);
      uVar16 = projName.field_2._M_allocated_capacity;
      _Var17 = projName._M_dataplus;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)projName._M_dataplus._M_p != &projName.field_2) {
LAB_0022abe7:
        operator_delete(_Var17._M_p,uVar16 + 1);
      }
LAB_0022abef:
      iVar9 = 1;
      bVar8 = false;
    }
LAB_0022af4c:
    cmCMakePresetsGraph::~cmCMakePresetsGraph((cmCMakePresetsGraph *)&output);
    if (!bVar8) {
      return iVar9;
    }
  }
  paVar18 = &output.field_2;
  bVar8 = cmsys::SystemTools::FileIsDirectory(dir);
  if (!bVar8) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error: ",7);
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,(dir->_M_dataplus)._M_p,dir->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15," is not a directory\n",0x14);
    return 1;
  }
  FindCacheFile(&cachePath,dir);
  bVar8 = LoadCache(this,&cachePath);
  if (!bVar8) {
    iVar9 = 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: could not load cache\n",0x1c);
    goto LAB_0022b60e;
  }
  pcVar5 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  output._M_dataplus._M_p = (pointer)paVar18;
  std::__cxx11::string::_M_construct<char_const*>((string *)&output,"CMAKE_GENERATOR","");
  cVar14 = cmState::GetCacheEntryValue(pcVar5,&output);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)output._M_dataplus._M_p != paVar18) {
    operator_delete(output._M_dataplus._M_p,
                    CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                             output.field_2._M_local_buf[0]) + 1);
  }
  if (cVar14.Value == (string *)0x0) {
    iVar9 = 1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: could not find CMAKE_GENERATOR in Cache\n",0x2f);
    goto LAB_0022b60e;
  }
  CreateGlobalGenerator((cmake *)&gen,(string *)this,SUB81(cVar14.Value,0));
  if ((__uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>)
      gen._M_t.super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
      _M_t.super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
      super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error: could not create CMAKE_GENERATOR \"",0x29);
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,((cVar14.Value)->_M_dataplus)._M_p,
                         (cVar14.Value)->_M_string_length);
    iVar9 = 1;
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\"\n",2);
  }
  else {
    local_8f0._M_t.
    super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
    super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
         (tuple<cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)
         (tuple<cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)
         gen._M_t.super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
         _M_t.super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
         super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
    gen._M_t.super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
    super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
    super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>,_true,_true>)
         (__uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>)0x0;
    SetGlobalGenerator(this,(unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                             *)&local_8f0);
    if ((_Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)
        local_8f0._M_t.
        super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
        super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl != (cmGlobalGenerator *)0x0)
    {
      (**(code **)(*(long *)local_8f0._M_t.
                            super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                            .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 8))();
    }
    local_8f0._M_t.
    super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
    super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
         (tuple<cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)
         (_Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)0x0;
    pcVar5 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    output._M_dataplus._M_p = (pointer)paVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)&output,"CMAKE_GENERATOR_INSTANCE","")
    ;
    cVar14 = cmState::GetCacheEntryValue(pcVar5,&output);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)output._M_dataplus._M_p != paVar18) {
      operator_delete(output._M_dataplus._M_p,
                      CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                               output.field_2._M_local_buf[0]) + 1);
    }
    if (cVar14.Value != (string *)0x0) {
      projName.field_2._M_allocated_capacity = (this->CurrentSnapshot).Position.Position;
      projName._M_dataplus._M_p = (pointer)(this->CurrentSnapshot).State;
      projName._M_string_length = (size_type)(this->CurrentSnapshot).Position.Tree;
      cmMakefile::cmMakefile
                ((cmMakefile *)&output,
                 (this->GlobalGenerator)._M_t.
                 super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                 .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
                 (cmStateSnapshot *)&projName);
      pcVar6 = (this->GlobalGenerator)._M_t.
               super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
               super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
      iVar9 = (*pcVar6->_vptr_cmGlobalGenerator[8])(pcVar6,cVar14.Value,&output);
      cmMakefile::~cmMakefile((cmMakefile *)&output);
      if ((char)iVar9 == '\0') {
        iVar9 = 1;
        goto LAB_0022b5fe;
      }
    }
    pcVar5 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    output._M_dataplus._M_p = (pointer)paVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)&output,"CMAKE_GENERATOR_PLATFORM","")
    ;
    cVar14 = cmState::GetCacheEntryValue(pcVar5,&output);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)output._M_dataplus._M_p != paVar18) {
      operator_delete(output._M_dataplus._M_p,
                      CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                               output.field_2._M_local_buf[0]) + 1);
    }
    if (cVar14.Value != (string *)0x0) {
      projName.field_2._M_allocated_capacity = (this->CurrentSnapshot).Position.Position;
      projName._M_dataplus._M_p = (pointer)(this->CurrentSnapshot).State;
      projName._M_string_length = (size_type)(this->CurrentSnapshot).Position.Tree;
      cmMakefile::cmMakefile
                ((cmMakefile *)&output,
                 (this->GlobalGenerator)._M_t.
                 super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                 .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
                 (cmStateSnapshot *)&projName);
      pcVar6 = (this->GlobalGenerator)._M_t.
               super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
               super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
      iVar9 = (*pcVar6->_vptr_cmGlobalGenerator[9])(pcVar6,cVar14.Value,&output);
      cmMakefile::~cmMakefile((cmMakefile *)&output);
      if ((char)iVar9 == '\0') {
        iVar9 = 1;
        goto LAB_0022b5fe;
      }
    }
    pcVar5 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    output._M_dataplus._M_p = (pointer)paVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)&output,"CMAKE_GENERATOR_TOOLSET","");
    cVar14 = cmState::GetCacheEntryValue(pcVar5,&output);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)output._M_dataplus._M_p != paVar18) {
      operator_delete(output._M_dataplus._M_p,
                      CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                               output.field_2._M_local_buf[0]) + 1);
    }
    if (cVar14.Value != (string *)0x0) {
      projName.field_2._M_allocated_capacity = (this->CurrentSnapshot).Position.Position;
      projName._M_dataplus._M_p = (pointer)(this->CurrentSnapshot).State;
      projName._M_string_length = (size_type)(this->CurrentSnapshot).Position.Tree;
      cmMakefile::cmMakefile
                ((cmMakefile *)&output,
                 (this->GlobalGenerator)._M_t.
                 super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                 .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
                 (cmStateSnapshot *)&projName);
      pcVar6 = (this->GlobalGenerator)._M_t.
               super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
               super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
      iVar9 = (*pcVar6->_vptr_cmGlobalGenerator[10])(pcVar6,cVar14.Value,1,&output);
      cmMakefile::~cmMakefile((cmMakefile *)&output);
      if ((char)iVar9 == '\0') {
        iVar9 = 1;
        goto LAB_0022b5fe;
      }
    }
    output._M_string_length = 0;
    output.field_2._M_local_buf[0] = '\0';
    projName._M_dataplus._M_p = (pointer)&projName.field_2;
    projName._M_string_length = 0;
    projName.field_2._M_allocated_capacity =
         projName.field_2._M_allocated_capacity & 0xffffffffffffff00;
    pcVar5 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    local_920._M_dataplus._M_p = (pointer)&local_920.field_2;
    output._M_dataplus._M_p = (pointer)paVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_920,"CMAKE_PROJECT_NAME","");
    cVar14 = cmState::GetCacheEntryValue(pcVar5,&local_920);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_920._M_dataplus._M_p != &local_920.field_2) {
      operator_delete(local_920._M_dataplus._M_p,local_920.field_2._M_allocated_capacity + 1);
    }
    if (cVar14.Value == (string *)0x0) {
      iVar9 = 1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error: could not find CMAKE_PROJECT_NAME in Cache\n",0x32);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&projName);
      pcVar5 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t
               .super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
               super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
      local_920._M_dataplus._M_p = (pointer)&local_920.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_920,"CMAKE_VERBOSE_MAKEFILE","");
      cVar14 = cmState::GetCacheEntryValue(pcVar5,&local_920);
      if (cVar14.Value == (string *)0x0) {
        bVar8 = false;
      }
      else {
        value._M_str = extraout_RDX;
        value._M_len = (size_t)((cVar14.Value)->_M_dataplus)._M_p;
        bVar8 = cmValue::IsOn((cmValue *)(cVar14.Value)->_M_string_length,value);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_920._M_dataplus._M_p != &local_920.field_2) {
        operator_delete(local_920._M_dataplus._M_p,local_920.field_2._M_allocated_capacity + 1);
      }
      pcVar6 = (this->GlobalGenerator)._M_t.
               super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
               super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
      iVar10 = (*pcVar6->_vptr_cmGlobalGenerator[0xb])
                         (pcVar6,(this->State)._M_t.
                                 super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                                 super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
      iVar9 = 1;
      if ((char)iVar10 != '\0') {
        pcVar6 = (this->GlobalGenerator)._M_t.
                 super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                 .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
        (*pcVar6->_vptr_cmGlobalGenerator[0x14])(pcVar6,&std::cerr,local_8f8);
        pcVar6 = (this->GlobalGenerator)._M_t.
                 super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                 .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
        local_920._M_dataplus._M_p = (pointer)&local_920.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_920,"");
        local_898._M_dataplus._M_p = (pointer)&local_898.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_898,"");
        iVar9 = cmGlobalGenerator::Build
                          (pcVar6,(int)local_8f8,&local_920,dir,&projName,targets,&output,&local_898
                           ,config,buildOptions,(bool)(bVar8 | local_921 & 1),(cmDuration)0x0,
                           OUTPUT_PASSTHROUGH,nativeOptions);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_898._M_dataplus._M_p != &local_898.field_2) {
          operator_delete(local_898._M_dataplus._M_p,local_898.field_2._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_920._M_dataplus._M_p != &local_920.field_2) {
          operator_delete(local_920._M_dataplus._M_p,local_920.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)projName._M_dataplus._M_p != &projName.field_2) {
      operator_delete(projName._M_dataplus._M_p,projName.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)output._M_dataplus._M_p != paVar18) {
      operator_delete(output._M_dataplus._M_p,
                      CONCAT71(output.field_2._M_allocated_capacity._1_7_,
                               output.field_2._M_local_buf[0]) + 1);
    }
  }
LAB_0022b5fe:
  if ((__uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>)
      gen._M_t.super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
      _M_t.super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
      super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>)0x0) {
    (**(code **)(*(long *)gen._M_t.
                          super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                          .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 8))();
  }
LAB_0022b60e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cachePath._M_dataplus._M_p != &cachePath.field_2) {
    operator_delete(cachePath._M_dataplus._M_p,cachePath.field_2._M_allocated_capacity + 1);
  }
  return iVar9;
}

Assistant:

int cmake::Build(int jobs, std::string dir, std::vector<std::string> targets,
                 std::string config, std::vector<std::string> nativeOptions,
                 cmBuildOptions& buildOptions, bool verbose,
                 const std::string& presetName, bool listPresets)
{
  this->SetHomeDirectory("");
  this->SetHomeOutputDirectory("");

#if !defined(CMAKE_BOOTSTRAP)
  if (!presetName.empty() || listPresets) {
    this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
    this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());

    cmCMakePresetsGraph settingsFile;
    auto result = settingsFile.ReadProjectPresets(this->GetHomeDirectory());
    if (result != cmCMakePresetsGraph::ReadFileResult::READ_OK) {
      cmSystemTools::Error(
        cmStrCat("Could not read presets from ", this->GetHomeDirectory(),
                 ": ", cmCMakePresetsGraph::ResultToString(result)));
      return 1;
    }

    if (listPresets) {
      settingsFile.PrintBuildPresetList();
      return 0;
    }

    auto presetPair = settingsFile.BuildPresets.find(presetName);
    if (presetPair == settingsFile.BuildPresets.end()) {
      cmSystemTools::Error(cmStrCat("No such build preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    presetName, '"'));
      settingsFile.PrintBuildPresetList();
      return 1;
    }

    if (presetPair->second.Unexpanded.Hidden) {
      cmSystemTools::Error(cmStrCat("Cannot use hidden build preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    presetName, '"'));
      settingsFile.PrintBuildPresetList();
      return 1;
    }

    auto const& expandedPreset = presetPair->second.Expanded;
    if (!expandedPreset) {
      cmSystemTools::Error(cmStrCat("Could not evaluate build preset \"",
                                    presetName,
                                    "\": Invalid macro expansion"));
      settingsFile.PrintBuildPresetList();
      return 1;
    }

    if (!expandedPreset->ConditionResult) {
      cmSystemTools::Error(cmStrCat("Cannot use disabled build preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    presetName, '"'));
      settingsFile.PrintBuildPresetList();
      return 1;
    }

    auto configurePresetPair =
      settingsFile.ConfigurePresets.find(expandedPreset->ConfigurePreset);
    if (configurePresetPair == settingsFile.ConfigurePresets.end()) {
      cmSystemTools::Error(cmStrCat("No such configure preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    expandedPreset->ConfigurePreset, '"'));
      this->PrintPresetList(settingsFile);
      return 1;
    }

    if (configurePresetPair->second.Unexpanded.Hidden) {
      cmSystemTools::Error(cmStrCat("Cannot use hidden configure preset in ",
                                    this->GetHomeDirectory(), ": \"",
                                    expandedPreset->ConfigurePreset, '"'));
      this->PrintPresetList(settingsFile);
      return 1;
    }

    auto const& expandedConfigurePreset = configurePresetPair->second.Expanded;
    if (!expandedConfigurePreset) {
      cmSystemTools::Error(cmStrCat("Could not evaluate configure preset \"",
                                    expandedPreset->ConfigurePreset,
                                    "\": Invalid macro expansion"));
      return 1;
    }

    if (!expandedConfigurePreset->BinaryDir.empty()) {
      dir = expandedConfigurePreset->BinaryDir;
    }

    this->UnprocessedPresetEnvironment = expandedPreset->Environment;
    this->ProcessPresetEnvironment();

    if ((jobs == cmake::DEFAULT_BUILD_PARALLEL_LEVEL ||
         jobs == cmake::NO_BUILD_PARALLEL_LEVEL) &&
        expandedPreset->Jobs) {
      jobs = *expandedPreset->Jobs;
    }

    if (targets.empty()) {
      targets.insert(targets.begin(), expandedPreset->Targets.begin(),
                     expandedPreset->Targets.end());
    }

    if (config.empty()) {
      config = expandedPreset->Configuration;
    }

    if (!buildOptions.Clean && expandedPreset->CleanFirst) {
      buildOptions.Clean = *expandedPreset->CleanFirst;
    }

    if (buildOptions.ResolveMode == PackageResolveMode::Default &&
        expandedPreset->ResolvePackageReferences) {
      buildOptions.ResolveMode = *expandedPreset->ResolvePackageReferences;
    }

    if (!verbose && expandedPreset->Verbose) {
      verbose = *expandedPreset->Verbose;
    }

    if (nativeOptions.empty()) {
      nativeOptions.insert(nativeOptions.begin(),
                           expandedPreset->NativeToolOptions.begin(),
                           expandedPreset->NativeToolOptions.end());
    }
  }
#endif

  if (!cmSystemTools::FileIsDirectory(dir)) {
    std::cerr << "Error: " << dir << " is not a directory\n";
    return 1;
  }

  std::string cachePath = FindCacheFile(dir);
  if (!this->LoadCache(cachePath)) {
    std::cerr << "Error: could not load cache\n";
    return 1;
  }
  cmValue cachedGenerator = this->State->GetCacheEntryValue("CMAKE_GENERATOR");
  if (!cachedGenerator) {
    std::cerr << "Error: could not find CMAKE_GENERATOR in Cache\n";
    return 1;
  }
  auto gen = this->CreateGlobalGenerator(*cachedGenerator);
  if (!gen) {
    std::cerr << "Error: could not create CMAKE_GENERATOR \""
              << *cachedGenerator << "\"\n";
    return 1;
  }
  this->SetGlobalGenerator(std::move(gen));
  cmValue cachedGeneratorInstance =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR_INSTANCE");
  if (cachedGeneratorInstance) {
    cmMakefile mf(this->GetGlobalGenerator(), this->GetCurrentSnapshot());
    if (!this->GlobalGenerator->SetGeneratorInstance(*cachedGeneratorInstance,
                                                     &mf)) {
      return 1;
    }
  }
  cmValue cachedGeneratorPlatform =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR_PLATFORM");
  if (cachedGeneratorPlatform) {
    cmMakefile mf(this->GetGlobalGenerator(), this->GetCurrentSnapshot());
    if (!this->GlobalGenerator->SetGeneratorPlatform(*cachedGeneratorPlatform,
                                                     &mf)) {
      return 1;
    }
  }
  cmValue cachedGeneratorToolset =
    this->State->GetCacheEntryValue("CMAKE_GENERATOR_TOOLSET");
  if (cachedGeneratorToolset) {
    cmMakefile mf(this->GetGlobalGenerator(), this->GetCurrentSnapshot());
    if (!this->GlobalGenerator->SetGeneratorToolset(*cachedGeneratorToolset,
                                                    true, &mf)) {
      return 1;
    }
  }
  std::string output;
  std::string projName;
  cmValue cachedProjectName =
    this->State->GetCacheEntryValue("CMAKE_PROJECT_NAME");
  if (!cachedProjectName) {
    std::cerr << "Error: could not find CMAKE_PROJECT_NAME in Cache\n";
    return 1;
  }
  projName = *cachedProjectName;

  if (cmIsOn(this->State->GetCacheEntryValue("CMAKE_VERBOSE_MAKEFILE"))) {
    verbose = true;
  }

#ifdef CMAKE_HAVE_VS_GENERATORS
  // For VS generators, explicitly check if regeneration is necessary before
  // actually starting the build. If not done separately from the build
  // itself, there is the risk of building an out-of-date solution file due
  // to limitations of the underlying build system.
  std::string const stampList = cachePath + "/" + "CMakeFiles/" +
    cmGlobalVisualStudio9Generator::GetGenerateStampList();

  // Note that the stampList file only exists for VS generators.
  if (cmSystemTools::FileExists(stampList)) {

    // Check if running for Visual Studio 9 - we need to explicitly run
    // the glob verification script before starting the build
    this->AddScriptingCommands();
    if (this->GlobalGenerator->MatchesGeneratorName("Visual Studio 9 2008")) {
      std::string const globVerifyScript =
        cachePath + "/" + "CMakeFiles/" + "VerifyGlobs.cmake";
      if (cmSystemTools::FileExists(globVerifyScript)) {
        std::vector<std::string> args;
        this->ReadListFile(args, globVerifyScript);
      }
    }

    if (!cmakeCheckStampList(stampList)) {
      // Correctly initialize the home (=source) and home output (=binary)
      // directories, which is required for running the generation step.
      std::string homeOrig = this->GetHomeDirectory();
      std::string homeOutputOrig = this->GetHomeOutputDirectory();
      this->SetDirectoriesFromFile(cachePath);

      this->AddProjectCommands();

      int ret = this->Configure();
      if (ret) {
        cmSystemTools::Message("CMake Configure step failed.  "
                               "Build files cannot be regenerated correctly.");
        return ret;
      }
      ret = this->Generate();
      if (ret) {
        cmSystemTools::Message("CMake Generate step failed.  "
                               "Build files cannot be regenerated correctly.");
        return ret;
      }
      std::string message = cmStrCat("Build files have been written to: ",
                                     this->GetHomeOutputDirectory());
      this->UpdateProgress(message, -1);

      // Restore the previously set directories to their original value.
      this->SetHomeDirectory(homeOrig);
      this->SetHomeOutputDirectory(homeOutputOrig);
    }
  }
#endif

  if (!this->GlobalGenerator->ReadCacheEntriesForBuild(*this->State)) {
    return 1;
  }

  this->GlobalGenerator->PrintBuildCommandAdvice(std::cerr, jobs);
  return this->GlobalGenerator->Build(
    jobs, "", dir, projName, targets, output, "", config, buildOptions,
    verbose, cmDuration::zero(), cmSystemTools::OUTPUT_PASSTHROUGH,
    nativeOptions);
}